

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

vector<char_data_*,_std::allocator<char_data_*>_> * __thiscall
CQueue::GetCharacterData<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>
          (vector<char_data_*,_std::allocator<char_data_*>_> *__return_storage_ptr__,CQueue *this,
          tuple<char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *t)

{
  vector<char_data_*,_std::allocator<char_data_*>_> *local_18;
  
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = __return_storage_ptr__;
  std::
  __invoke_impl<void,CQueue::GetCharacterData<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>(std::tuple<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>&)::_lambda((auto:1_const&)___)_1_,char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>
            (&local_18,
             (t->
             super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).super__Head_base<0UL,_char_data_*&,_false>._M_head_impl,
             (t->
             super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Tuple_impl<1UL,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .super__Head_base<1UL,_char_data_*&,_false>._M_head_impl,
             (t->
             super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Tuple_impl<1UL,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .
             super__Tuple_impl<2UL,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .super__Head_base<2UL,_const_char_(&)[48],_false>._M_head_impl,
             (t->
             super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Tuple_impl<1UL,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .
             super__Tuple_impl<2UL,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .
             super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .
             super__Head_base<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
             ._M_head_impl);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CHAR_DATA*> GetCharacterData(std::tuple<Tp...>& t)
	{
		std::vector<CHAR_DATA*> accumulator;

		std::apply([&] (const auto&... tupleArgs) 
		{
			auto processTuple = [&](const auto& x)
			{
				// decay x to get the actual argument type to compare to our character data type 
		 		if constexpr (std::is_same<typename std::decay<decltype(x)>::type,CHAR_DATA*>::value)
					accumulator.push_back(x);
			};
			(processTuple(tupleArgs), ...);  // fold expression - calls processTuple for each argument in tupleArgs
		}, t);

		return accumulator;
	}